

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

JavascriptArray *
Js::JavascriptOperators::GetOwnEnumerablePropertyNames
          (RecyclableObject *object,ScriptContext *scriptContext)

{
  code *pcVar1;
  undefined4 itemIndex;
  JavascriptArray *this;
  ScriptContext *obj;
  bool bVar2;
  int iVar3;
  PropertyId propertyId;
  BOOL BVar4;
  JavascriptLibrary *this_00;
  undefined4 extraout_var;
  undefined4 *puVar5;
  Var newValue;
  JavascriptArray *local_98;
  undefined1 local_90 [8];
  PropertyDescriptor propertyDescriptor;
  uint32 i;
  uint32 index;
  PropertyRecord *propertyRecord;
  Var element;
  JavascriptArray *pJStack_40;
  uint32 resultLength;
  JavascriptArray *proxyResultToReturn;
  JavascriptArray *proxyResult;
  JavascriptProxy *proxy;
  ScriptContext *scriptContext_local;
  RecyclableObject *object_local;
  RecyclableObject *local_10;
  
  proxy = (JavascriptProxy *)scriptContext;
  scriptContext_local = (ScriptContext *)object;
  local_10 = object;
  bVar2 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(object);
  if (bVar2) {
    local_98 = (JavascriptArray *)UnsafeVarTo<Js::JavascriptProxy,Js::RecyclableObject>(local_10);
  }
  else {
    local_98 = (JavascriptArray *)0x0;
  }
  proxyResult = local_98;
  if (local_98 == (JavascriptArray *)0x0) {
    object_local = (RecyclableObject *)
                   JavascriptObject::CreateOwnEnumerableStringPropertiesHelper
                             ((RecyclableObject *)scriptContext_local,(ScriptContext *)proxy);
  }
  else {
    proxyResultToReturn =
         Js::JavascriptProxy::PropertyKeysTrap
                   ((JavascriptProxy *)local_98,GetOwnPropertyNamesKind,(ScriptContext *)proxy);
    this_00 = ScriptContext::GetLibrary((ScriptContext *)proxy);
    pJStack_40 = JavascriptLibrary::CreateArray(this_00,0);
    element._4_4_ = ArrayObject::GetLength(&proxyResultToReturn->super_ArrayObject);
    _i = (PropertyRecord *)0x0;
    propertyDescriptor._44_4_ = 0;
    propertyDescriptor.Configurable = false;
    propertyDescriptor.fromProxy = false;
    propertyDescriptor._42_2_ = 0;
    for (; (uint)propertyDescriptor._40_4_ < element._4_4_;
        propertyDescriptor._40_4_ = propertyDescriptor._40_4_ + 1) {
      iVar3 = (*(proxyResultToReturn->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x72])(proxyResultToReturn,(ulong)(uint)propertyDescriptor._40_4_);
      propertyRecord = (PropertyRecord *)CONCAT44(extraout_var,iVar3);
      bVar2 = VarIs<Js::JavascriptSymbol>(propertyRecord);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x506,"(!VarIs<JavascriptSymbol>(element))",
                                    "!VarIs<JavascriptSymbol>(element)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_90);
      JavascriptConversion::ToPropertyKey
                (propertyRecord,(ScriptContext *)proxy,(PropertyRecord **)&i,(PropertyString **)0x0)
      ;
      obj = scriptContext_local;
      propertyId = PropertyRecord::GetPropertyId(_i);
      BVar4 = GetOwnPropertyDescriptor
                        ((RecyclableObject *)obj,propertyId,(ScriptContext *)proxy,
                         (PropertyDescriptor *)local_90);
      if ((BVar4 != 0) &&
         (bVar2 = PropertyDescriptor::IsEnumerable((PropertyDescriptor *)local_90),
         this = pJStack_40, itemIndex = propertyDescriptor._44_4_, bVar2)) {
        propertyDescriptor._44_4_ = propertyDescriptor._44_4_ + 1;
        newValue = CrossSite::MarshalVar((ScriptContext *)proxy,propertyRecord,false);
        Js::JavascriptArray::DirectSetItemAt<void*>(this,itemIndex,newValue);
      }
    }
    object_local = (RecyclableObject *)pJStack_40;
  }
  return (JavascriptArray *)object_local;
}

Assistant:

JavascriptArray* JavascriptOperators::GetOwnEnumerablePropertyNames(RecyclableObject* object, ScriptContext* scriptContext)
    {
        JavascriptProxy* proxy = JavascriptOperators::TryFromVar<JavascriptProxy>(object);
        if (proxy)
        {
            JavascriptArray* proxyResult = proxy->PropertyKeysTrap(JavascriptProxy::KeysTrapKind::GetOwnPropertyNamesKind, scriptContext);
            JavascriptArray* proxyResultToReturn = scriptContext->GetLibrary()->CreateArray(0);

            // filter enumerable keys
            uint32 resultLength = proxyResult->GetLength();
            Var element;
            const Js::PropertyRecord *propertyRecord = nullptr;
            uint32 index = 0;
            for (uint32 i = 0; i < resultLength; i++)
            {
                element = proxyResult->DirectGetItem(i);

                Assert(!VarIs<JavascriptSymbol>(element));

                PropertyDescriptor propertyDescriptor;
                JavascriptConversion::ToPropertyKey(element, scriptContext, &propertyRecord, nullptr);
                if (JavascriptOperators::GetOwnPropertyDescriptor(object, propertyRecord->GetPropertyId(), scriptContext, &propertyDescriptor))
                {
                    if (propertyDescriptor.IsEnumerable())
                    {
                        proxyResultToReturn->DirectSetItemAt(index++, CrossSite::MarshalVar(scriptContext, element));
                    }
                }
            }
            return proxyResultToReturn;
        }

        return JavascriptObject::CreateOwnEnumerableStringPropertiesHelper(object, scriptContext);
    }